

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O2

ze_result_t
tracing_layer::zeCommandListAppendImageCopyFromMemoryExt
          (ze_command_list_handle_t hCommandList,ze_image_handle_t hDstImage,void *srcptr,
          ze_image_region_t *pDstRegion,uint32_t srcRowPitch,uint32_t srcSlicePitch,
          ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  ulong uVar1;
  _func__ze_result_t__ze_command_list_handle_t_ptr__ze_image_handle_t_ptr_void_ptr__ze_image_region_t_ptr_uint_uint__ze_event_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr
  *zeApiPtr;
  _ze_result_t _Var2;
  char *pcVar3;
  undefined1 *puVar4;
  ulong *puVar5;
  _func_void__ze_command_list_append_image_copy_from_memory_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var6;
  long lVar7;
  size_t i;
  ulong uVar8;
  uint32_t srcSlicePitch_local;
  uint32_t srcRowPitch_local;
  ze_image_region_t *pDstRegion_local;
  void *srcptr_local;
  ze_image_handle_t hDstImage_local;
  ze_command_list_handle_t hCommandList_local;
  ze_event_handle_t *local_120;
  ulong local_118;
  ze_event_handle_t local_110;
  APITracerCallbackDataImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_a8;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_90;
  ze_command_list_append_image_copy_from_memory_ext_params_t tracerParams;
  
  local_118 = (ulong)numWaitEvents;
  if (DAT_00189440 ==
      (_func__ze_result_t__ze_command_list_handle_t_ptr__ze_image_handle_t_ptr_void_ptr__ze_image_region_t_ptr_uint_uint__ze_event_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr
       *)0x0) {
    _Var2 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    local_120 = phWaitEvents;
    local_110 = hSignalEvent;
    srcSlicePitch_local = srcSlicePitch;
    srcRowPitch_local = srcRowPitch;
    pDstRegion_local = pDstRegion;
    srcptr_local = srcptr;
    hDstImage_local = hDstImage;
    hCommandList_local = hCommandList;
    pcVar3 = (char *)tracingInProgress();
    if (*pcVar3 == '\0') {
      puVar4 = (undefined1 *)tracingInProgress();
      *puVar4 = 1;
      tracerParams.phCommandList = &hCommandList_local;
      tracerParams.phDstImage = &hDstImage_local;
      tracerParams.psrcptr = &srcptr_local;
      tracerParams.ppDstRegion = &pDstRegion_local;
      tracerParams.psrcRowPitch = &srcRowPitch_local;
      tracerParams.phSignalEvent = &hSignalEvent;
      tracerParams.pnumWaitEvents = &numWaitEvents;
      tracerParams.pphWaitEvents = &phWaitEvents;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      apiCallbackData.prologCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      apiCallbackData.prologCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      apiCallbackData.apiOrdinal =
           (_func_void__ze_command_list_append_image_copy_from_memory_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
            *)0x0;
      apiCallbackData.prologCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tracerParams.psrcSlicePitch = &srcSlicePitch_local;
      puVar5 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar5 == (ulong *)0x0) {
        p_Var6 = (_func_void__ze_command_list_append_image_copy_from_memory_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                  *)0x0;
      }
      else {
        lVar7 = 0xcb0;
        for (uVar8 = 0; p_Var6 = apiCallbackData.apiOrdinal, uVar8 < *puVar5; uVar8 = uVar8 + 1) {
          uVar1 = puVar5[1];
          prologCallback.current_api_callback =
               *(_func_void__ze_command_list_append_image_copy_from_memory_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)((uVar1 - 0x9a8) + lVar7);
          p_Var6 = *(_func_void__ze_command_list_append_image_copy_from_memory_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)((uVar1 - 0x350) + lVar7);
          prologCallback.pUserData = *(void **)(uVar1 + lVar7);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back(&apiCallbackData.prologCallbacks,&prologCallback);
          epilogCallback.pUserData = *(void **)(puVar5[1] + lVar7);
          epilogCallback.current_api_callback = p_Var6;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back(&apiCallbackData.epilogCallbacks,&epilogCallback);
          lVar7 = lVar7 + 0xcb8;
        }
      }
      zeApiPtr = DAT_00189440;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&local_90,&apiCallbackData.prologCallbacks);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&local_a8,&apiCallbackData.epilogCallbacks);
      _Var2 = APITracerWrapperImp<_ze_result_t(*)(_ze_command_list_handle_t*,_ze_image_handle_t*,void_const*,_ze_image_region_t_const*,unsigned_int,unsigned_int,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t**),_ze_command_list_append_image_copy_from_memory_ext_params_t*,void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>>>,_ze_command_list_handle_t*&,_ze_image_handle_t*&,void_const*&,_ze_image_region_t_const*&,unsigned_int&,unsigned_int&,_ze_event_handle_t*&,unsigned_int&,_ze_event_handle_t**&>
                        (zeApiPtr,&tracerParams,p_Var6,
                         (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          *)&local_90,
                         (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          *)&local_a8,&hCommandList_local,&hDstImage_local,&srcptr_local,
                         &pDstRegion_local,&srcRowPitch_local,&srcSlicePitch_local,&hSignalEvent,
                         &numWaitEvents,&phWaitEvents);
      std::
      _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~_Vector_base(&local_a8);
      std::
      _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~_Vector_base(&local_90);
      APITracerCallbackDataImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp(&apiCallbackData);
    }
    else {
      _Var2 = (*DAT_00189440)(hCommandList,hDstImage,srcptr,pDstRegion,srcRowPitch,srcSlicePitch,
                              local_110,(uint)local_118,local_120);
    }
  }
  return _Var2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendImageCopyFromMemoryExt(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        ze_image_handle_t hDstImage,                    ///< [in] handle of destination image to copy to
        const void* srcptr,                             ///< [in] pointer to source memory to copy from
        const ze_image_region_t* pDstRegion,            ///< [in][optional] destination region descriptor
        uint32_t srcRowPitch,                           ///< [in] size in bytes of the 1D slice of the 2D region of a 2D or 3D
                                                        ///< image or each image of a 1D or 2D image array being read
        uint32_t srcSlicePitch,                         ///< [in] size in bytes of the 2D slice of the 3D region of a 3D image or
                                                        ///< each image of a 1D or 2D image array being read
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        auto pfnAppendImageCopyFromMemoryExt = context.zeDdiTable.CommandList.pfnAppendImageCopyFromMemoryExt;

        if( nullptr == pfnAppendImageCopyFromMemoryExt)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.CommandList.pfnAppendImageCopyFromMemoryExt, hCommandList, hDstImage, srcptr, pDstRegion, srcRowPitch, srcSlicePitch, hSignalEvent, numWaitEvents, phWaitEvents);

        // capture parameters
        ze_command_list_append_image_copy_from_memory_ext_params_t tracerParams = {
            &hCommandList,
            &hDstImage,
            &srcptr,
            &pDstRegion,
            &srcRowPitch,
            &srcSlicePitch,
            &hSignalEvent,
            &numWaitEvents,
            &phWaitEvents
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnCommandListAppendImageCopyFromMemoryExtCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnCommandListAppendImageCopyFromMemoryExtCb_t, CommandList, pfnAppendImageCopyFromMemoryExtCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.CommandList.pfnAppendImageCopyFromMemoryExt,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phCommandList,
                                                  *tracerParams.phDstImage,
                                                  *tracerParams.psrcptr,
                                                  *tracerParams.ppDstRegion,
                                                  *tracerParams.psrcRowPitch,
                                                  *tracerParams.psrcSlicePitch,
                                                  *tracerParams.phSignalEvent,
                                                  *tracerParams.pnumWaitEvents,
                                                  *tracerParams.pphWaitEvents);
    }